

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtConvexTriangleMeshShape.cpp
# Opt level: O2

cbtVector3 __thiscall
cbtConvexTriangleMeshShape::localGetSupportingVertex
          (cbtConvexTriangleMeshShape *this,cbtVector3 *vec)

{
  float in_XMM0_Da;
  float fVar1;
  ulong uVar2;
  undefined8 in_YMM1_H;
  cbtVector3 cVar3;
  float local_48;
  undefined4 uStack_44;
  float local_38;
  float fStack_34;
  cbtVector3 local_28;
  
  (*(this->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
    super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x11])();
  (*(this->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
    super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    local_28.m_floats._0_8_ = *(undefined8 *)vec->m_floats;
    local_28.m_floats._8_8_ = *(undefined8 *)(vec->m_floats + 2);
    fVar1 = cbtVector3::length2(&local_28);
    if (fVar1 < 1.4210855e-14) {
      fVar1 = -1.0;
      local_28.m_floats[0] = -1.0;
      local_28.m_floats[1] = -1.0;
      local_28.m_floats[2] = -1.0;
      local_28.m_floats[3] = 0.0;
    }
    cbtVector3::normalize(&local_28);
    (*(this->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
      super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
      _vptr_cbtCollisionShape[0xc])(this);
    local_38 = (float)in_YMM1_H;
    fStack_34 = (float)((ulong)in_YMM1_H >> 0x20);
    uVar2 = (ulong)(uint)(local_48 + fVar1 * local_28.m_floats[2]);
    in_YMM1_H = CONCAT44(fStack_34 + fVar1 * local_28.m_floats[1],
                         local_38 + fVar1 * local_28.m_floats[0]);
  }
  else {
    uVar2 = CONCAT44(uStack_44,local_48);
  }
  cVar3.m_floats[2] = (cbtScalar)(int)uVar2;
  cVar3.m_floats[3] = (cbtScalar)(int)(uVar2 >> 0x20);
  cVar3.m_floats[0] = (cbtScalar)(int)in_YMM1_H;
  cVar3.m_floats[1] = (cbtScalar)(int)((ulong)in_YMM1_H >> 0x20);
  return (cbtVector3)cVar3.m_floats;
}

Assistant:

cbtVector3 cbtConvexTriangleMeshShape::localGetSupportingVertex(const cbtVector3& vec) const
{
	cbtVector3 supVertex = localGetSupportingVertexWithoutMargin(vec);

	if (getMargin() != cbtScalar(0.))
	{
		cbtVector3 vecnorm = vec;
		if (vecnorm.length2() < (SIMD_EPSILON * SIMD_EPSILON))
		{
			vecnorm.setValue(cbtScalar(-1.), cbtScalar(-1.), cbtScalar(-1.));
		}
		vecnorm.normalize();
		supVertex += getMargin() * vecnorm;
	}
	return supVertex;
}